

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauge.hpp
# Opt level: O0

void __thiscall
ylt::metric::basic_dynamic_gauge<long,_(unsigned_char)'\x00'>::dec
          (basic_dynamic_gauge<long,_(unsigned_char)__x00_> *this,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
          *labels_value,long value)

{
  element_type *peVar1;
  long in_RDX;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
  *in_RSI;
  dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_> *in_RDI;
  
  dynamic_metric_impl<std::atomic<long>,(unsigned_char)0>::
  try_emplace<std::array<std::__cxx11::string,0ul>const&>(in_RDI,in_RSI);
  peVar1 = std::
           __shared_ptr_access<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x00'>::metric_pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x226651);
  detail::dec_impl<long>(&peVar1->value,in_RDX);
  std::
  pair<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x00'>::metric_pair>,_bool>
  ::~pair((pair<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x00_>::metric_pair>,_bool>
           *)0x22666c);
  return;
}

Assistant:

void dec(const std::array<std::string, N>& labels_value,
           value_type value = 1) {
    detail::dec_impl(Base::try_emplace(labels_value).first->value, value);
  }